

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O0

void __thiscall Assimp::BVHLoader::ReadNodeOffset(BVHLoader *this,aiNode *pNode)

{
  aiMatrix4x4t<float> local_64;
  undefined1 local_24 [8];
  aiVector3D offset;
  aiNode *pNode_local;
  BVHLoader *this_local;
  
  offset._4_8_ = pNode;
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_24);
  local_24._0_4_ = GetNextTokenAsFloat(this);
  local_24._4_4_ = GetNextTokenAsFloat(this);
  offset.x = GetNextTokenAsFloat(this);
  aiMatrix4x4t<float>::aiMatrix4x4t
            (&local_64,1.0,0.0,0.0,(float)local_24._0_4_,0.0,1.0,0.0,(float)local_24._4_4_,0.0,0.0,
             1.0,offset.x,0.0,0.0,0.0,1.0);
  memcpy((void *)(offset._4_8_ + 0x404),&local_64,0x40);
  return;
}

Assistant:

void BVHLoader::ReadNodeOffset( aiNode* pNode)
{
    // Offset consists of three floats to read
    aiVector3D offset;
    offset.x = GetNextTokenAsFloat();
    offset.y = GetNextTokenAsFloat();
    offset.z = GetNextTokenAsFloat();

    // build a transformation matrix from it
    pNode->mTransformation = aiMatrix4x4( 1.0f, 0.0f, 0.0f, offset.x,
                                          0.0f, 1.0f, 0.0f, offset.y,
                                          0.0f, 0.0f, 1.0f, offset.z,
                                          0.0f, 0.0f, 0.0f, 1.0f);
}